

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O0

size_t VW_HashFeatureStaticA(char *s,unsigned_long u,char *h,uint num_bits)

{
  uint64_t uVar1;
  char *in_RDX;
  char *in_RDI;
  string hash;
  string str;
  string local_c0 [12];
  uint32_t in_stack_ffffffffffffff4c;
  string *in_stack_ffffffffffffff50;
  unsigned_long in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [40];
  char *local_18;
  
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,in_RDI,&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,local_18,&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff60,local_40);
  std::__cxx11::string::string(local_c0,local_78);
  uVar1 = VW::hash_feature_static
                    (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                     in_stack_ffffffffffffff4c);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_40);
  return uVar1;
}

Assistant:

VW_DLL_MEMBER size_t VW_CALLING_CONV VW_HashFeatureStaticA(const char * s, unsigned long u, const char * h = "strings", unsigned int num_bits = 18)
{ string str(s);
  string hash(h);
  return VW::hash_feature_static(str, u, hash, num_bits);
}